

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

bool __thiscall
Darts::Details::DawgBuilder::are_equal(DawgBuilder *this,id_type node_id,id_type unit_id)

{
  bool bVar1;
  byte bVar2;
  id_type iVar3;
  DawgNode *pDVar4;
  DawgUnit *pDVar5;
  byte *pbVar6;
  id_type in_ESI;
  id_type i_1;
  id_type i;
  size_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  id_type in_stack_ffffffffffffffd4;
  id_type local_20;
  id_type local_1c;
  bool local_1;
  
  pDVar4 = AutoPool<Darts::Details::DawgNode>::operator[]
                     ((AutoPool<Darts::Details::DawgNode> *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
  local_1c = DawgNode::sibling(pDVar4);
  while (local_1c != 0) {
    pDVar5 = AutoPool<Darts::Details::DawgUnit>::operator[]
                       ((AutoPool<Darts::Details::DawgUnit> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    bVar1 = DawgUnit::has_sibling(pDVar5);
    if (!bVar1) {
      return false;
    }
    pDVar4 = AutoPool<Darts::Details::DawgNode>::operator[]
                       ((AutoPool<Darts::Details::DawgNode> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    local_1c = DawgNode::sibling(pDVar4);
  }
  pDVar5 = AutoPool<Darts::Details::DawgUnit>::operator[]
                     ((AutoPool<Darts::Details::DawgUnit> *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
  bVar1 = DawgUnit::has_sibling(pDVar5);
  local_20 = in_ESI;
  if (bVar1) {
    local_1 = false;
  }
  else {
    while (local_20 != 0) {
      pDVar4 = AutoPool<Darts::Details::DawgNode>::operator[]
                         ((AutoPool<Darts::Details::DawgNode> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffd4 = DawgNode::unit(pDVar4);
      pDVar5 = AutoPool<Darts::Details::DawgUnit>::operator[]
                         ((AutoPool<Darts::Details::DawgUnit> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      iVar3 = DawgUnit::unit(pDVar5);
      if (in_stack_ffffffffffffffd4 != iVar3) {
        return false;
      }
      pDVar4 = AutoPool<Darts::Details::DawgNode>::operator[]
                         ((AutoPool<Darts::Details::DawgNode> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      bVar2 = DawgNode::label(pDVar4);
      in_stack_ffffffffffffffd0 = (uint)bVar2;
      pbVar6 = AutoPool<unsigned_char>::operator[]
                         ((AutoPool<unsigned_char> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      if (in_stack_ffffffffffffffd0 != *pbVar6) {
        return false;
      }
      pDVar4 = AutoPool<Darts::Details::DawgNode>::operator[]
                         ((AutoPool<Darts::Details::DawgNode> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      local_20 = DawgNode::sibling(pDVar4);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool DawgBuilder::are_equal(id_type node_id, id_type unit_id) const {
  for (id_type i = nodes_[node_id].sibling(); i != 0;
      i = nodes_[i].sibling()) {
    if (units_[unit_id].has_sibling() == false) {
      return false;
    }
    ++unit_id;
  }
  if (units_[unit_id].has_sibling() == true) {
    return false;
  }

  for (id_type i = node_id; i != 0; i = nodes_[i].sibling(), --unit_id) {
    if (nodes_[i].unit() != units_[unit_id].unit() ||
        nodes_[i].label() != labels_[unit_id]) {
      return false;
    }
  }
  return true;
}